

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O2

uint64_t scale_counts(vector<unsigned_int,_std::allocator<unsigned_int>_> *F,size_t maxv,int silent)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [16];
  undefined1 in_XMM2 [16];
  
  puVar1 = (F->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = 0;
  for (sVar6 = 0; maxv != sVar6; sVar6 = sVar6 + 1) {
    uVar8 = puVar1[sVar6 + 1] - 1;
    puVar1[sVar6 + 1] = uVar8;
    lVar7 = lVar7 + (ulong)uVar8;
  }
  auVar3 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,lVar7);
  puVar1 = (F->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = 0;
  lVar7 = 1;
  lVar9 = lVar7;
  for (; lVar7 - maxv != 1; lVar7 = lVar7 + 1) {
    auVar2 = vcvtusi2sd_avx512f(in_XMM2,puVar1[lVar7]);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (2147483648.0 / auVar3._0_8_) * auVar2._0_8_;
    uVar8 = vcvttsd2usi_avx512f(auVar10);
    puVar1[lVar7] = uVar8;
    lVar4 = lVar7;
    if (uVar8 <= puVar1[lVar9]) {
      lVar4 = lVar9;
    }
    lVar9 = lVar4;
    iVar5 = iVar5 + uVar8;
  }
  puVar1 = (F->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[lVar9] = (puVar1[lVar9] - iVar5) + 0x80000000;
  return 0x80000000;
}

Assistant:

uint64_t scale_counts(std::vector<uint32_t>& F, size_t maxv, int silent)
{
    size_t power;
    double ratio;
    size_t maxsym;
    uint64_t total;
    int i;
    power = TBTS;
    total = 0;
    for (i = 1; i <= maxv; i++) {
        /* shift from 1-origin back to 0-origin */
        F[i]--;
        total += F[i];
    }
    ratio = ((double)(1LL << power)) / total;

    /* do the adjustment, tracking the new total and also locating the
       most probable symbol */
    maxsym = 1;
    total = 0;
    for (i = 1; i <= maxv; i++) {
        /* these are still offset by 1 after the interp step */
        F[i] = F[i] * ratio;
        total += F[i];
        if (F[i] > F[maxsym]) {
            maxsym = i;
        }
    }
    /* allocate the leftover remainder as a bonus to the MFS */
    F[maxsym] += (1LL << power) - total;
    return (1LL << power);
}